

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr_acl.c
# Opt level: O0

int netaddr_acl_from_strarray(netaddr_acl *acl,const_strarray *value)

{
  int iVar1;
  netaddr *pnVar2;
  size_t sVar3;
  bool bVar4;
  char *local_40;
  char *addr;
  char *ptr;
  size_t reject_count;
  size_t accept_count;
  const_strarray *value_local;
  netaddr_acl *acl_local;
  
  reject_count = 0;
  ptr = (char *)0x0;
  netaddr_acl_remove(acl);
  addr = value->value;
  while( true ) {
    bVar4 = false;
    if (addr != (char *)0x0) {
      bVar4 = addr < value->value + value->length;
    }
    if (!bVar4) break;
    iVar1 = netaddr_acl_handle_keywords(acl,addr);
    if (iVar1 != 0) {
      if (*addr == '-') {
        ptr = ptr + 1;
      }
      else {
        reject_count = reject_count + 1;
      }
    }
    sVar3 = strlen(addr);
    addr = addr + sVar3 + 1;
  }
  if (reject_count != 0) {
    pnVar2 = (netaddr *)calloc(reject_count,0x12);
    acl->accept = pnVar2;
    if (acl->accept == (netaddr *)0x0) goto LAB_0017171b;
  }
  if (ptr != (char *)0x0) {
    pnVar2 = (netaddr *)calloc((size_t)ptr,0x12);
    acl->reject = pnVar2;
    if (acl->reject == (netaddr *)0x0) {
LAB_0017171b:
      netaddr_acl_remove(acl);
      return -1;
    }
  }
  addr = value->value;
  do {
    bVar4 = false;
    if (addr != (char *)0x0) {
      bVar4 = addr < value->value + value->length;
    }
    if (!bVar4) {
      return 0;
    }
    iVar1 = netaddr_acl_handle_keywords(acl,addr);
    if (iVar1 != 0) {
      if ((*addr == '-') || (*addr == '+')) {
        local_40 = addr + 1;
      }
      else {
        local_40 = addr;
      }
      if (*addr == '-') {
        iVar1 = netaddr_from_string(acl->reject + acl->reject_count,local_40);
        if (iVar1 != 0) goto LAB_0017171b;
        acl->reject_count = acl->reject_count + 1;
      }
      else {
        iVar1 = netaddr_from_string(acl->accept + acl->accept_count,local_40);
        if (iVar1 != 0) goto LAB_0017171b;
        acl->accept_count = acl->accept_count + 1;
      }
    }
    sVar3 = strlen(addr);
    addr = addr + sVar3 + 1;
  } while( true );
}

Assistant:

int
netaddr_acl_from_strarray(struct netaddr_acl *acl, const struct const_strarray *value) {
  size_t accept_count, reject_count;
  const char *ptr, *addr;

  accept_count = 0;
  reject_count = 0;

  /* clear acl struct and free existing data */
  netaddr_acl_remove(acl);

  /* count number of address entries */
  strarray_for_each_element(value, ptr) {
    if (netaddr_acl_handle_keywords(acl, ptr) == 0) {
      continue;
    }

    if (ptr[0] == '-') {
      reject_count++;
    }
    else {
      accept_count++;
    }
  }

  /* allocate memory */
  if (accept_count > 0) {
    acl->accept = calloc(accept_count, sizeof(struct netaddr));
    if (acl->accept == NULL) {
      goto from_entry_error;
    }
  }
  if (reject_count > 0) {
    acl->reject = calloc(reject_count, sizeof(struct netaddr));
    if (acl->reject == NULL) {
      goto from_entry_error;
    }
  }

  /* read netaddr strings into buffers */
  strarray_for_each_element(value, ptr) {
    if (netaddr_acl_handle_keywords(acl, ptr) == 0) {
      continue;
    }

    if (*ptr == '-' || *ptr == '+') {
      addr = &ptr[1];
    }
    else {
      addr = ptr;
    }

    if (*ptr == '-') {
      if (netaddr_from_string(&acl->reject[acl->reject_count], addr)) {
        goto from_entry_error;
      }
      acl->reject_count++;
    }
    else {
      if (netaddr_from_string(&acl->accept[acl->accept_count], addr)) {
        goto from_entry_error;
      }
      acl->accept_count++;
    }
  }
  return 0;

from_entry_error:
  netaddr_acl_remove(acl);
  return -1;
}